

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampDepthCompareCase::getIteration
          (IterationConfig *__return_storage_ptr__,TextureBorderClampDepthCompareCase *this,int ndx)

{
  TextureBorderClampTest::IterationConfig::IterationConfig
            (__return_storage_ptr__,
             (this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
             ._M_impl.super__Vector_impl_data._M_start + ndx);
  return __return_storage_ptr__;
}

Assistant:

TextureBorderClampTest::IterationConfig TextureBorderClampDepthCompareCase::getIteration (int ndx) const
{
	return m_iterations[ndx];
}